

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fms.c
# Opt level: O0

int FmsDataCollectionCompare(FmsDataCollection lhs,FmsDataCollection rhs)

{
  int iVar1;
  FmsDataCollection in_RSI;
  FmsDataCollection in_RDI;
  FmsMesh unaff_retaddr;
  FmsMetaData rhs_md;
  FmsMetaData lhs_md;
  FmsInt i_1;
  FmsInt rhs_nfields;
  FmsInt lhs_nfields;
  FmsField *rhs_fields;
  FmsField *lhs_fields;
  FmsInt i;
  FmsInt rhs_nfds;
  FmsInt lhs_nfds;
  FmsFieldDescriptor *rhs_fds;
  FmsFieldDescriptor *lhs_fds;
  FmsMesh rhs_mesh;
  FmsMesh lhs_mesh;
  char *rhs_name;
  char *lhs_name;
  int diff;
  FmsFieldDescriptor in_stack_ffffffffffffff60;
  FmsFieldDescriptor in_stack_ffffffffffffff68;
  FmsField rhs_00;
  FmsField lhs_00;
  FmsMetaData rhs_01;
  FmsMetaData lhs_01;
  FmsField *local_70;
  FmsField local_68;
  FmsField local_60;
  FmsField local_58;
  FmsFieldDescriptor *local_50;
  FmsFieldDescriptor *local_48;
  FmsMesh local_40;
  FmsMesh local_38;
  char *local_30;
  char *local_28;
  int local_1c;
  FmsDataCollection local_18;
  FmsDataCollection local_10;
  int local_4;
  
  if (in_RDI == in_RSI) {
    local_4 = 0;
  }
  else if (in_RDI == (FmsDataCollection)0x0) {
    local_4 = -1;
  }
  else if (in_RSI == (FmsDataCollection)0x0) {
    local_4 = -2;
  }
  else {
    local_1c = 0;
    local_28 = (char *)0x0;
    local_30 = (char *)0x0;
    local_18 = in_RSI;
    local_10 = in_RDI;
    FmsDataCollectionGetName(in_RDI,&local_28);
    FmsDataCollectionGetName(local_18,&local_30);
    iVar1 = strcmp(local_28,local_30);
    if (iVar1 != 0) {
      local_1c = local_1c + 1;
    }
    local_38 = (FmsMesh)0x0;
    local_40 = (FmsMesh)0x0;
    FmsDataCollectionGetMesh(local_10,&local_38);
    FmsDataCollectionGetMesh(local_18,&local_40);
    iVar1 = FmsMeshCompare((FmsMesh)rhs_md,unaff_retaddr);
    if (iVar1 != 0) {
      local_1c = local_1c + 10;
    }
    local_48 = (FmsFieldDescriptor *)0x0;
    local_50 = (FmsFieldDescriptor *)0x0;
    local_58 = (FmsField)0x0;
    local_60 = (FmsField)0xffffffffffffffff;
    FmsDataCollectionGetFieldDescriptors(local_10,&local_48,(FmsInt *)&local_58);
    FmsDataCollectionGetFieldDescriptors(local_18,&local_50,(FmsInt *)&local_60);
    if (local_58 == local_60) {
      for (local_68 = (FmsField)0x0; local_68 < local_58;
          local_68 = (FmsField)((long)&local_68->name + 1)) {
        iVar1 = FmsFieldDescriptorCompare(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
        if (iVar1 != 0) {
          local_1c = local_1c + 100;
        }
      }
    }
    else {
      local_1c = local_1c + 100;
    }
    local_70 = (FmsField *)0x0;
    lhs_01 = (FmsMetaData)0x0;
    rhs_01 = (FmsMetaData)0x0;
    lhs_00 = (FmsField)0xffffffffffffffff;
    FmsDataCollectionGetFields(local_10,&local_70,(FmsInt *)&stack0xffffffffffffff80);
    FmsDataCollectionGetFields
              (local_18,(FmsField **)&stack0xffffffffffffff88,(FmsInt *)&stack0xffffffffffffff78);
    if (local_58 == local_60) {
      for (rhs_00 = (FmsField)0x0; rhs_00 < local_58; rhs_00 = (FmsField)((long)&rhs_00->name + 1))
      {
        iVar1 = FmsFieldCompare(lhs_00,rhs_00);
        if (iVar1 != 0) {
          local_1c = local_1c + 1000;
        }
      }
    }
    else {
      local_1c = local_1c + 1000;
    }
    FmsDataCollectionGetMetaData(local_10,(FmsMetaData *)&stack0xffffffffffffff68);
    FmsDataCollectionGetMetaData(local_18,(FmsMetaData *)&stack0xffffffffffffff60);
    iVar1 = FmsMetaDataCompare(lhs_01,rhs_01);
    if (iVar1 != 0) {
      local_1c = local_1c + 10000;
    }
    local_4 = local_1c;
  }
  return local_4;
}

Assistant:

int FmsDataCollectionCompare(FmsDataCollection lhs, FmsDataCollection rhs) {
  if(lhs == rhs) return 0;
  if(!lhs) return -1;
  if(!rhs) return -2;
  // Compare names
  int diff = 0;
  const char *lhs_name = NULL;
  const char *rhs_name = NULL;
  FmsDataCollectionGetName(lhs, &lhs_name);
  FmsDataCollectionGetName(rhs, &rhs_name);
  if(strcmp(lhs_name, rhs_name)) {
    diff += 1;
  }

  // Compare mesh topologies
  FmsMesh lhs_mesh = NULL, rhs_mesh = NULL;
  FmsDataCollectionGetMesh(lhs, &lhs_mesh);
  FmsDataCollectionGetMesh(rhs, &rhs_mesh);
  if(FmsMeshCompare(lhs_mesh, rhs_mesh)) {
    diff += 10;
  }

  // Compare FieldDescriptors
  FmsFieldDescriptor *lhs_fds = NULL, *rhs_fds = NULL;
  FmsInt lhs_nfds = 0, rhs_nfds = -1;
  FmsDataCollectionGetFieldDescriptors(lhs, &lhs_fds, &lhs_nfds);
  FmsDataCollectionGetFieldDescriptors(rhs, &rhs_fds, &rhs_nfds);
  if(lhs_nfds != rhs_nfds) {
    diff += 100;
  } else {
    for(FmsInt i = 0; i < lhs_nfds; i++) {
      if(FmsFieldDescriptorCompare(lhs_fds[i], rhs_fds[i])) {
        diff += 100;
      }
    }
  }

  // Compare Fields
  FmsField *lhs_fields = NULL, *rhs_fields = NULL;
  FmsInt lhs_nfields = 0, rhs_nfields = -1;
  FmsDataCollectionGetFields(lhs, &lhs_fields, &lhs_nfields);
  FmsDataCollectionGetFields(rhs, &rhs_fields, &rhs_nfields);
  if(lhs_nfds != rhs_nfds) {
    diff += 1000;
  } else {
    for(FmsInt i = 0; i < lhs_nfds; i++) {
      if(FmsFieldCompare(lhs_fields[i], rhs_fields[i])) {
        diff += 1000;
      }
    }
  }

  // Compare MetaData
  FmsMetaData lhs_md = NULL, rhs_md = NULL;
  FmsDataCollectionGetMetaData(lhs, &lhs_md);
  FmsDataCollectionGetMetaData(rhs, &rhs_md);
  if(FmsMetaDataCompare(lhs_md, rhs_md)) {
    diff += 10000;
  }
  return diff;
}